

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void setge_(PDISASM pMyDisasm)

{
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    failDecode(pMyDisasm);
  }
  else {
    (pMyDisasm->Instruction).Category = 0x10005;
    strcpy((pMyDisasm->Instruction).Mnemonic,"setnl");
    (pMyDisasm->Reserved_).MemDecoration = 1;
    (pMyDisasm->Reserved_).OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1,pMyDisasm);
    (pMyDisasm->Reserved_).OperandSize = 0x20;
    (pMyDisasm->Reserved_).EIP_ =
         (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
    FillFlags(pMyDisasm,0x5f);
  }
  return;
}

Assistant:

void __bea_callspec__ setge_(PDISASM pMyDisasm)
{
  if (GV.VEX.state == InUsePrefix) {
    failDecode(pMyDisasm);
    return;
  }

    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "setnl");
    #endif
    GV.MemDecoration = Arg1byte;
    GV.OperandSize = 8;
    decodeModrm(&pMyDisasm->Operand1, pMyDisasm);
    GV.OperandSize = 32;
    GV.EIP_+= GV.DECALAGE_EIP+2;
    FillFlags(pMyDisasm,95);
}